

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

char * ma_log_level_to_string(ma_uint32 logLevel)

{
  if (logLevel - 1 < 4) {
    return &DAT_00194344 + *(int *)(&DAT_00194344 + (ulong)(logLevel - 1) * 4);
  }
  return "ERROR";
}

Assistant:

MA_API const char* ma_log_level_to_string(ma_uint32 logLevel)
{
    switch (logLevel)
    {
        case MA_LOG_LEVEL_DEBUG:   return "DEBUG";
        case MA_LOG_LEVEL_INFO:    return "INFO";
        case MA_LOG_LEVEL_WARNING: return "WARNING";
        case MA_LOG_LEVEL_ERROR:   return "ERROR";
        default:                   return "ERROR";
    }
}